

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log4z.h
# Opt level: O0

CStringStream * __thiscall zsummer::log4z::CStringStream::operator<<(CStringStream *this,void *t)

{
  void *t_local;
  CStringStream *this_local;
  
  WriteData<unsigned_long_long>(this,"%016llx",(unsigned_long_long)t);
  return this;
}

Assistant:

inline CStringStream & operator <<(void * t)
	{
#ifdef WIN32
		if (sizeof(t) == 8)
		{
			WriteData("%016I64x", (unsigned long long)t);
		}
		else
		{
			WriteData("%08I64x", (unsigned long long)t);
		}
#else
		if (sizeof(t) == 8)
		{
			WriteData("%016llx", (unsigned long long)t);
		}
		else
		{
			WriteData("%08llx", (unsigned long long)t);
		}
#endif
		return *this;
	}